

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall LowererMD::EmitSignExtend(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType type;
  int iVar3;
  int iVar4;
  Opnd *this_00;
  Opnd *pOVar5;
  Opnd *this_01;
  undefined4 *puVar6;
  Instr *instr_00;
  OpCode local_34;
  OpCode op;
  IRType fromType;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *instr_local;
  LowererMD *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  pOVar5 = IR::Instr::GetSrc1(instr);
  this_01 = IR::Instr::GetSrc2(instr);
  if (((this_00 == (Opnd *)0x0) || (pOVar5 == (Opnd *)0x0)) || (this_01 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1b7c,"(dst && src1 && src2)","dst && src1 && src2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar3 = IR::Opnd::GetSize(this_01);
  iVar4 = IR::Opnd::GetSize(this_00);
  if (iVar4 <= iVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1b7f,"(src2->GetSize() < dst->GetSize())",
                       "src2->GetSize() < dst->GetSize()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  type = IR::Opnd::GetType(this_01);
  local_34 = MOVSX;
  iVar3 = IR::Opnd::GetSize(this_01);
  if (iVar3 != 1) {
    if (iVar3 == 2) {
      local_34 = MOVSXW;
    }
    else if (iVar3 == 4) {
      local_34 = MOVSXD;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1b8e,"((0))","UNREACHED");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  pOVar5 = IR::Opnd::UseWithNewType(pOVar5,type,this->m_func);
  instr_00 = IR::Instr::New(local_34,this_00,pOVar5,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  Legalize<false>(instr->m_prev,false);
  return;
}

Assistant:

void LowererMD::EmitSignExtend(IR::Instr * instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(dst && src1 && src2);

    // Src2 is used to determine what's the from type size
    Assert(src2->GetSize() < dst->GetSize());
    IRType fromType = src2->GetType();
    Js::OpCode op = Js::OpCode::MOVSX;
    switch (src2->GetSize())
    {
    case 1: break; // default
    case 2: op = Js::OpCode::MOVSXW; break;
    case 4:
#if _M_X64
        op = Js::OpCode::MOVSXD;
#else
        op = LowererMDArch::GetAssignOp(fromType);
#endif
        break;
    default:
        Assert(UNREACHED);
    }

#if _M_IX86
    // Special handling of int64 on x86
    if (dst->IsInt64())
    {
        Int64RegPair dstPair = m_func->FindOrCreateInt64Pair(dst);
        Int64RegPair srcPair = m_func->FindOrCreateInt64Pair(src1);

        IR::RegOpnd * eaxReg = IR::RegOpnd::New(RegEAX, TyInt32, m_func);
        IR::RegOpnd * edxReg = IR::RegOpnd::New(RegEDX, TyInt32, m_func);

        instr->InsertBefore(IR::Instr::New(op, eaxReg, srcPair.low->UseWithNewType(fromType, m_func), m_func));
        Legalize(instr->m_prev);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::CDQ, edxReg, m_func));
        Legalize(instr->m_prev);
        m_lowerer->InsertMove(dstPair.low, eaxReg, instr);
        m_lowerer->InsertMove(dstPair.high, edxReg, instr);
    }
    else
#endif
    {
        instr->InsertBefore(IR::Instr::New(op, dst, src1->UseWithNewType(fromType, m_func), m_func));
        Legalize(instr->m_prev);
    }
}